

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::TLVReader::TLVReader(TLVReader *this,byte_t *p,ui32_t c,IPrimerLookup *PrimerLookup)

{
  _Rb_tree_header *p_Var1;
  byte_t bVar2;
  byte_t bVar3;
  ILogSink *this_00;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  Result_t result;
  int local_100 [26];
  pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_> local_98 [8];
  
  Kumu::MemIOReader::MemIOReader(&this->super_MemIOReader,p,c);
  p_Var1 = &(this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_Lookup = PrimerLookup;
  Kumu::Result_t::Result_t((Result_t *)local_100,(Result_t *)&Kumu::RESULT_OK);
  uVar7 = (this->super_MemIOReader).m_capacity;
  uVar4 = (this->super_MemIOReader).m_size;
  if ((uVar7 != uVar4) && (-1 < local_100[0])) {
    do {
      if (uVar7 < uVar4 + 1) {
LAB_001a3272:
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Malformed Set\n");
        std::
        _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::clear(&(this->m_ElementMap)._M_t);
        Kumu::Result_t::operator()((int *)local_98,ASDCP::RESULT_KLV_CODING);
        Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_98);
        Kumu::Result_t::~Result_t((Result_t *)local_98);
      }
      else {
        bVar2 = (this->super_MemIOReader).m_p[uVar4];
        (this->super_MemIOReader).m_size = uVar4 + 1;
        uVar4 = (this->super_MemIOReader).m_size;
        uVar5 = uVar4 + 1;
        if (uVar7 < uVar5) goto LAB_001a3272;
        bVar3 = (this->super_MemIOReader).m_p[uVar4];
        (this->super_MemIOReader).m_size = uVar5;
        uVar4 = (this->super_MemIOReader).m_size;
        if ((ulong)uVar7 < (ulong)uVar4 + 2) goto LAB_001a3272;
        uVar6 = *(ushort *)((this->super_MemIOReader).m_p + uVar4);
        uVar6 = uVar6 << 8 | uVar6 >> 8;
        (this->super_MemIOReader).m_size = uVar4 + 2;
        local_98[0].first.b = bVar3;
        local_98[0].first.a = bVar2;
        local_98[0].second.second._0_2_ = uVar6;
        local_98[0].second.first = (this->super_MemIOReader).m_size;
        local_98[0].second.second._2_2_ = 0;
        std::
        _Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
        ::_M_insert_unique<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>
                  ((_Rb_tree<ASDCP::TagValue,std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>,std::less<ASDCP::TagValue>,std::allocator<std::pair<ASDCP::TagValue_const,std::pair<unsigned_int,unsigned_int>>>>
                    *)&this->m_ElementMap,local_98);
        uVar7 = (uint)uVar6 + (this->super_MemIOReader).m_size;
        if ((this->super_MemIOReader).m_capacity < uVar7) goto LAB_001a3272;
        (this->super_MemIOReader).m_size = uVar7;
      }
      uVar7 = (this->super_MemIOReader).m_capacity;
      uVar4 = (this->super_MemIOReader).m_size;
    } while ((uVar7 != uVar4) && (-1 < local_100[0]));
  }
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  return;
}

Assistant:

ASDCP::MXF::TLVReader::TLVReader(const byte_t* p, ui32_t c, IPrimerLookup* PrimerLookup) :
  MemIOReader(p, c), m_Lookup(PrimerLookup)
{
  Result_t result = RESULT_OK;

  while ( Remainder() > 0 && ASDCP_SUCCESS(result) )
    {
      TagValue Tag;
      ui16_t pkt_len = 0;

      if ( MemIOReader::ReadUi8(&Tag.a) )
	if ( MemIOReader::ReadUi8(&Tag.b) )
	  if ( MemIOReader::ReadUi16BE(&pkt_len) )
	    {
	      m_ElementMap.insert(TagMap::value_type(Tag, ItemInfo(m_size, pkt_len)));
	      if ( SkipOffset(pkt_len) )
		continue;;
	    }

      DefaultLogSink().Error("Malformed Set\n");
      m_ElementMap.clear();
      result = RESULT_KLV_CODING(__LINE__, __FILE__);
    }
}